

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_7::ReplaceCubeFaceCoord
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  IRContext *this;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TypeManager *this_00;
  ConstantManager *this_01;
  Type *type;
  FeatureManager *pFVar5;
  Constant *c;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  SmallVector<unsigned_int,_2UL> local_160;
  Instruction *local_138;
  Instruction *local_130;
  Instruction *local_128;
  Instruction *local_120;
  Instruction *local_118;
  Instruction *local_110;
  Instruction *local_108;
  Instruction *local_100;
  uint32_t local_f8;
  uint32_t local_f4;
  uint32_t local_f0;
  uint32_t local_ec;
  undefined1 local_e8 [56];
  IRContext *local_b0;
  Instruction *local_a8;
  Instruction *local_a0;
  Instruction *local_98;
  Instruction *local_90;
  Instruction *local_88;
  Instruction *local_80;
  Instruction *local_78;
  Instruction *local_70;
  InstructionBuilder ir_builder;
  OperandList new_operands;
  
  this_00 = IRContext::get_type_mgr(ctx);
  this_01 = IRContext::get_constant_mgr(ctx);
  local_f8 = analysis::TypeManager::GetFloatTypeId(this_00);
  type = analysis::TypeManager::GetFloatVectorType(this_00,2);
  local_f0 = analysis::TypeManager::GetId(this_00,type);
  uVar1 = analysis::TypeManager::GetBoolTypeId(this_00);
  local_128 = (Instruction *)CONCAT44(local_128._4_4_,uVar1);
  InstructionBuilder::InstructionBuilder
            (&ir_builder,ctx,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  local_70 = inst;
  uVar2 = Instruction::GetSingleWordInOperand(inst,2);
  local_b0 = ctx;
  pFVar5 = IRContext::get_feature_mgr(ctx);
  uVar1 = pFVar5->extinst_importid_GLSLstd450_;
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"GLSL.std.450",(allocator<char> *)&local_160);
    this = local_b0;
    IRContext::AddExtInstImport(local_b0,(string *)local_e8);
    std::__cxx11::string::_M_dispose();
    pFVar5 = IRContext::get_feature_mgr(this);
    uVar1 = pFVar5->extinst_importid_GLSLstd450_;
  }
  local_138 = (Instruction *)CONCAT44(local_138._4_4_,uVar1);
  uVar1 = analysis::ConstantManager::GetFloatConstId(this_01,0.0);
  local_118 = (Instruction *)CONCAT44(local_118._4_4_,uVar1);
  uVar1 = analysis::ConstantManager::GetFloatConstId(this_01,2.0);
  local_110 = (Instruction *)CONCAT44(local_110._4_4_,uVar1);
  local_160._vptr_SmallVector._0_4_ = analysis::ConstantManager::GetFloatConstId(this_01,0.5);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  local_160._vptr_SmallVector._4_4_ = (uint32_t)local_160._vptr_SmallVector;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160);
  c = analysis::ConstantManager::GetConstant
                (this_01,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  pIVar6 = analysis::ConstantManager::GetDefiningInstruction(this_01,c,0,(inst_iterator *)0x0);
  local_f4 = Instruction::result_id(pIVar6);
  local_160._vptr_SmallVector._0_4_ = 0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             (undefined1 *)((long)&local_160._vptr_SmallVector + 4));
  uVar4 = local_f8;
  local_108 = InstructionBuilder::AddCompositeExtract
                        (&ir_builder,local_f8,uVar2,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_160._vptr_SmallVector._0_4_ = 1;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             (undefined1 *)((long)&local_160._vptr_SmallVector + 4));
  pIVar7 = InstructionBuilder::AddCompositeExtract
                     (&ir_builder,uVar4,uVar2,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_160._vptr_SmallVector._0_4_ = 2;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             (undefined1 *)((long)&local_160._vptr_SmallVector + 4));
  pIVar8 = InstructionBuilder::AddCompositeExtract
                     (&ir_builder,uVar4,uVar2,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_100 = pIVar8;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  pIVar6 = local_108;
  uVar1 = Instruction::result_id(local_108);
  local_80 = InstructionBuilder::AddUnaryOp(&ir_builder,uVar4,OpFNegate,uVar1);
  local_120 = pIVar7;
  uVar1 = Instruction::result_id(pIVar7);
  local_78 = InstructionBuilder::AddUnaryOp(&ir_builder,uVar4,OpFNegate,uVar1);
  uVar1 = Instruction::result_id(pIVar8);
  local_a0 = InstructionBuilder::AddUnaryOp(&ir_builder,uVar4,OpFNegate,uVar1);
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(pIVar6);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             (undefined1 *)((long)&local_160._vptr_SmallVector + 4));
  uVar1 = (uint32_t)local_138;
  local_130 = InstructionBuilder::AddNaryExtendedInstruction
                        (&ir_builder,uVar4,(uint32_t)local_138,4,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(pIVar7);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             (undefined1 *)((long)&local_160._vptr_SmallVector + 4));
  local_a8 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,uVar4,uVar1,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  pIVar6 = local_100;
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(local_100);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             (undefined1 *)((long)&local_160._vptr_SmallVector + 4));
  local_90 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,uVar4,uVar1,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  uVar3 = Instruction::result_id(pIVar6);
  uVar1 = (uint32_t)local_128;
  uVar2 = (uint32_t)local_118;
  local_88 = InstructionBuilder::AddBinaryOp
                       (&ir_builder,(uint32_t)local_128,OpFOrdLessThan,uVar3,(uint32_t)local_118);
  uVar3 = Instruction::result_id(local_120);
  local_120 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdLessThan,uVar3,uVar2);
  uVar3 = Instruction::result_id(local_108);
  local_118 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdLessThan,uVar3,uVar2);
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(local_130);
  local_160._vptr_SmallVector._4_4_ = Instruction::result_id(local_a8);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             &local_160.size_);
  uVar1 = (uint32_t)local_138;
  pIVar7 = InstructionBuilder::AddNaryExtendedInstruction
                     (&ir_builder,uVar4,(uint32_t)local_138,0x28,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_98 = pIVar7;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  pIVar6 = local_90;
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(local_90);
  local_160._vptr_SmallVector._4_4_ = Instruction::result_id(pIVar7);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             &local_160.size_);
  pIVar7 = InstructionBuilder::AddNaryExtendedInstruction
                     (&ir_builder,uVar4,uVar1,0x28,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  uVar1 = Instruction::result_id(pIVar7);
  local_138 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar4,OpFMul,(uint32_t)local_110,uVar1);
  uVar2 = Instruction::result_id(pIVar6);
  uVar3 = Instruction::result_id(local_98);
  uVar1 = (uint32_t)local_128;
  local_110 = InstructionBuilder::AddBinaryOp
                        (&ir_builder,(uint32_t)local_128,OpFOrdGreaterThanEqual,uVar2,uVar3);
  uVar2 = Instruction::result_id(local_110);
  pIVar6 = InstructionBuilder::AddUnaryOp(&ir_builder,uVar1,OpLogicalNot,uVar2);
  uVar2 = Instruction::result_id(local_a8);
  uVar3 = Instruction::result_id(local_130);
  pIVar7 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdGreaterThanEqual,uVar2,uVar3);
  uVar2 = Instruction::result_id(pIVar6);
  uVar3 = Instruction::result_id(pIVar7);
  pIVar7 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpLogicalAnd,uVar2,uVar3);
  local_128 = pIVar7;
  uVar1 = Instruction::result_id(local_88);
  uVar2 = Instruction::result_id(local_80);
  pIVar6 = local_108;
  uVar3 = Instruction::result_id(local_108);
  local_130 = InstructionBuilder::AddSelect(&ir_builder,uVar4,uVar1,uVar2,uVar3);
  uVar1 = Instruction::result_id(local_118);
  uVar2 = Instruction::result_id(local_100);
  uVar3 = Instruction::result_id(local_a0);
  pIVar8 = InstructionBuilder::AddSelect(&ir_builder,uVar4,uVar1,uVar2,uVar3);
  uVar1 = Instruction::result_id(pIVar7);
  uVar2 = Instruction::result_id(pIVar6);
  uVar3 = Instruction::result_id(pIVar8);
  pIVar6 = InstructionBuilder::AddSelect(&ir_builder,uVar4,uVar1,uVar2,uVar3);
  uVar1 = Instruction::result_id(local_110);
  uVar2 = Instruction::result_id(local_130);
  uVar3 = Instruction::result_id(pIVar6);
  pIVar6 = InstructionBuilder::AddSelect(&ir_builder,uVar4,uVar1,uVar2,uVar3);
  uVar1 = Instruction::result_id(local_120);
  uVar2 = Instruction::result_id(local_a0);
  uVar3 = Instruction::result_id(local_100);
  pIVar7 = InstructionBuilder::AddSelect(&ir_builder,uVar4,uVar1,uVar2,uVar3);
  uVar1 = Instruction::result_id(local_128);
  uVar2 = Instruction::result_id(pIVar7);
  uVar3 = Instruction::result_id(local_78);
  pIVar7 = InstructionBuilder::AddSelect(&ir_builder,uVar4,uVar1,uVar2,uVar3);
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(pIVar6);
  local_160._vptr_SmallVector._4_4_ = Instruction::result_id(pIVar7);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             &local_160.size_);
  uVar1 = local_f0;
  pIVar7 = InstructionBuilder::AddCompositeConstruct
                     (&ir_builder,local_f0,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  pIVar6 = local_138;
  local_160._vptr_SmallVector._0_4_ = Instruction::result_id(local_138);
  local_160._vptr_SmallVector._4_4_ = Instruction::result_id(pIVar6);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_e8,&local_160,
             &local_160.size_);
  pIVar6 = InstructionBuilder::AddCompositeConstruct
                     (&ir_builder,uVar1,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  uVar2 = Instruction::result_id(pIVar7);
  uVar4 = Instruction::result_id(pIVar6);
  pIVar7 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFDiv,uVar2,uVar4);
  pIVar6 = local_70;
  local_70->opcode_ = OpFAdd;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ec = Instruction::result_id(pIVar7);
  init_list._M_len = 1;
  init_list._M_array = &local_ec;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_160,init_list);
  local_e8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),&local_160);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_e8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_160);
  local_ec = local_f4;
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_ec;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_160,init_list_00);
  local_e8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),&local_160);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_e8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_160);
  Instruction::SetInOperands(pIVar6,&new_operands);
  IRContext::UpdateDefUse(local_b0,pIVar6);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            (&new_operands);
  return true;
}

Assistant:

bool ReplaceCubeFaceCoord(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  uint32_t float_type_id = type_mgr->GetFloatTypeId();
  const analysis::Type* v2_float_type = type_mgr->GetFloatVectorType(2);
  uint32_t v2_float_type_id = type_mgr->GetId(v2_float_type);
  uint32_t bool_id = type_mgr->GetBoolTypeId();

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t input_id = inst->GetSingleWordInOperand(2);
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  // Get the constants that will be used.
  uint32_t f0_const_id = const_mgr->GetFloatConstId(0.0);
  uint32_t f2_const_id = const_mgr->GetFloatConstId(2.0);
  uint32_t f0_5_const_id = const_mgr->GetFloatConstId(0.5);
  const analysis::Constant* vec_const =
      const_mgr->GetConstant(v2_float_type, {f0_5_const_id, f0_5_const_id});
  uint32_t vec_const_id =
      const_mgr->GetDefiningInstruction(vec_const)->result_id();

  // Extract the input values.
  Instruction* x = ir_builder.AddCompositeExtract(float_type_id, input_id, {0});
  Instruction* y = ir_builder.AddCompositeExtract(float_type_id, input_id, {1});
  Instruction* z = ir_builder.AddCompositeExtract(float_type_id, input_id, {2});

  // Negate the input values.
  Instruction* nx =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, x->result_id());
  Instruction* ny =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, y->result_id());
  Instruction* nz =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, z->result_id());

  // Get the abolsute values of the inputs.
  Instruction* ax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {x->result_id()});
  Instruction* ay = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {y->result_id()});
  Instruction* az = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {z->result_id()});

  // Find which values are negative.  Used in later computations.
  Instruction* is_z_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, z->result_id(), f0_const_id);
  Instruction* is_y_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, y->result_id(), f0_const_id);
  Instruction* is_x_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, x->result_id(), f0_const_id);

  // Compute cubema
  Instruction* amax_x_y = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {ax->result_id(), ay->result_id()});
  Instruction* amax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {az->result_id(), amax_x_y->result_id()});
  Instruction* cubema = ir_builder.AddBinaryOp(float_type_id, spv::Op::OpFMul,
                                               f2_const_id, amax->result_id());

  // Do the comparisons needed for computing cubesc and cubetc.
  Instruction* is_z_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             az->result_id(), amax_x_y->result_id());
  Instruction* not_is_z_max = ir_builder.AddUnaryOp(
      bool_id, spv::Op::OpLogicalNot, is_z_max->result_id());
  Instruction* y_gr_x =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             ay->result_id(), ax->result_id());
  Instruction* is_y_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpLogicalAnd,
                             not_is_z_max->result_id(), y_gr_x->result_id());

  // Select the correct value for cubesc.
  Instruction* cubesc_case_1 = ir_builder.AddSelect(
      float_type_id, is_z_neg->result_id(), nx->result_id(), x->result_id());
  Instruction* cubesc_case_2 = ir_builder.AddSelect(
      float_type_id, is_x_neg->result_id(), z->result_id(), nz->result_id());
  Instruction* sel =
      ir_builder.AddSelect(float_type_id, is_y_max->result_id(), x->result_id(),
                           cubesc_case_2->result_id());
  Instruction* cubesc =
      ir_builder.AddSelect(float_type_id, is_z_max->result_id(),
                           cubesc_case_1->result_id(), sel->result_id());

  // Select the correct value for cubetc.
  Instruction* cubetc_case_1 = ir_builder.AddSelect(
      float_type_id, is_y_neg->result_id(), nz->result_id(), z->result_id());
  Instruction* cubetc =
      ir_builder.AddSelect(float_type_id, is_y_max->result_id(),
                           cubetc_case_1->result_id(), ny->result_id());

  // Do the division
  Instruction* cube = ir_builder.AddCompositeConstruct(
      v2_float_type_id, {cubesc->result_id(), cubetc->result_id()});
  Instruction* denom = ir_builder.AddCompositeConstruct(
      v2_float_type_id, {cubema->result_id(), cubema->result_id()});
  Instruction* div = ir_builder.AddBinaryOp(
      v2_float_type_id, spv::Op::OpFDiv, cube->result_id(), denom->result_id());

  // Get the final result by adding 0.5 to |div|.
  inst->SetOpcode(spv::Op::OpFAdd);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {div->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {vec_const_id}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}